

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seose_compat.cpp
# Opt level: O1

string * seose_str_hash(string *__return_storage_ptr__,string *input,string *key)

{
  byte bVar1;
  uint16_t input_00;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  int j;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (key->_M_string_length != 0) {
    uVar7 = 0;
    do {
      bVar1 = (key->_M_dataplus)._M_p[uVar7];
      uVar2 = (uint)bVar1;
      if (bVar1 == 0x23) {
        uVar2 = 0xa3;
      }
      uVar7 = uVar7 + 1;
      if (input->_M_string_length == 0) {
        input_00 = 0;
      }
      else {
        uVar3 = 0;
        sVar4 = 0;
        do {
          lVar5 = 7;
          do {
            uVar6 = uVar2 * (int)uVar7;
            if ((short)uVar3 < 0 ==
                ((*(uint *)(&DAT_001a77e0 + lVar5 * 4) & ~(int)(input->_M_dataplus)._M_p[sVar4]) ==
                0)) {
              uVar6 = 0;
            }
            uVar3 = uVar3 * 2 ^ uVar6;
            input_00 = (uint16_t)uVar3;
            bVar8 = lVar5 != 0;
            lVar5 = lVar5 + -1;
          } while (bVar8);
          sVar4 = sVar4 + 1;
        } while (sVar4 != input->_M_string_length);
      }
      seose_to_base62_abi_cxx11_(&local_50,input_00);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while (uVar7 < key->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string seose_str_hash(const std::string& input, const std::string& key)
{
	std::string result;

	for (std::size_t i = 0; i < key.length(); ++i)
	{
		unsigned char kc = key[i];

		// Remind me to strangle Sordie for using pound symbols in the default key
		if (kc == '#')
			kc = char(0xA3); // pound character

		result += seose_to_base62(seose_hash(input.data(), input.length(), (i + 1) * kc));
	}

	return result;
}